

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.cc
# Opt level: O3

ostream * absl::lts_20240722::time_internal::cctz::detail::operator<<(ostream *os,civil_hour *h)

{
  ushort uVar1;
  long lVar2;
  ostream *poVar3;
  stringstream ss;
  char local_1c9;
  civil_day local_1c8;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  long local_198 [2];
  undefined8 auStack_188 [12];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1c8.f_.y = (h->f_).y;
  uVar1._0_1_ = (h->f_).m;
  uVar1._1_1_ = (h->f_).d;
  local_1c8.f_._8_4_ = ZEXT24(uVar1);
  local_1c8.f_._12_4_ = local_1c8.f_._12_4_ & 0xffffff00;
  poVar3 = operator<<((ostream *)local_198,&local_1c8);
  local_1c9 = 'T';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1c9,1);
  lVar2 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar2 + 1] == '\0') {
    std::ios::widen((char)(ostream *)local_198 + (char)lVar2);
    acStack_b8[lVar2 + 1] = '\x01';
  }
  acStack_b8[lVar2] = '0';
  *(undefined8 *)((long)auStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  std::ostream::operator<<((ostream *)local_198,(int)(h->f_).hh);
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(char *)local_1c8.f_.y,CONCAT44(local_1c8.f_._12_4_,local_1c8.f_._8_4_));
  if ((long *)local_1c8.f_.y != local_1b8) {
    operator_delete((void *)local_1c8.f_.y,local_1b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const civil_hour& h) {
  std::stringstream ss;
  ss << civil_day(h) << 'T';
  ss << std::setfill('0') << std::setw(2) << h.hour();
  return os << ss.str();
}